

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void vkt::anon_unknown_0::specializeProgramSources
               (ProgramSources *dst,ProgramSources *src,ProgramSpecializationParams *specParams)

{
  ProgramSources *this;
  ProgramSeparable local_21;
  ProgramSpecializationParams *local_20;
  ProgramSpecializationParams *specParams_local;
  ProgramSources *src_local;
  ProgramSources *dst_local;
  
  local_20 = specParams;
  specParams_local = (ProgramSpecializationParams *)src;
  src_local = dst;
  specializeShaderSources
            (dst,src,specParams,SHADERTYPE_VERTEX,
             vkt::(anonymous_namespace)::generateVertexSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_FRAGMENT,
             vkt::(anonymous_namespace)::generateFragmentSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_GEOMETRY,
             vkt::(anonymous_namespace)::generateGeometrySpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_TESSELLATION_CONTROL,
             vkt::(anonymous_namespace)::generateTessControlSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,
             SHADERTYPE_TESSELLATION_EVALUATION,
             vkt::(anonymous_namespace)::generateTessEvalSpecialization_abi_cxx11_);
  this = src_local;
  glu::ProgramSeparable::ProgramSeparable
            (&local_21,(bool)(*(byte *)&specParams_local[5].caseSpec & 1));
  glu::ProgramSources::operator<<(this,&local_21);
  return;
}

Assistant:

void specializeProgramSources (glu::ProgramSources&					dst,
							   const glu::ProgramSources&			src,
							   const ProgramSpecializationParams&	specParams)
{
	specializeShaderSources(dst, src, specParams, glu::SHADERTYPE_VERTEX,					generateVertexSpecialization);
	specializeShaderSources(dst, src, specParams, glu::SHADERTYPE_FRAGMENT,					generateFragmentSpecialization);
	specializeShaderSources(dst, src, specParams, glu::SHADERTYPE_GEOMETRY,					generateGeometrySpecialization);
	specializeShaderSources(dst, src, specParams, glu::SHADERTYPE_TESSELLATION_CONTROL,		generateTessControlSpecialization);
	specializeShaderSources(dst, src, specParams, glu::SHADERTYPE_TESSELLATION_EVALUATION,	generateTessEvalSpecialization);

	dst << glu::ProgramSeparable(src.separable);
}